

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::File>::tryCommit
          (ReplacerImpl<kj::File> *this)

{
  Impl *this_00;
  InMemoryDirectory *pIVar1;
  size_t sVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> this_01;
  long lVar3;
  WriteMode mode;
  char *pcVar4;
  void *in_R8;
  bool bVar5;
  StringPtr name;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> local_48;
  Own<const_kj::File> local_38;
  void *__child_stack;
  
  if ((this->super_Replacer<kj::File>).field_0xc == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              ((Fault *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x580,FAILED,"!committed","\"commit() already called\"",
               (char (*) [24])"commit() already called");
    _::Debug::Fault::~Fault((Fault *)&local_48);
    bVar5 = true;
  }
  else {
    pIVar1 = (this->directory).ptr;
    _::Mutex::lock(&(pIVar1->impl).mutex,EXCLUSIVE);
    this_00 = &(pIVar1->impl).value;
    sVar2 = (this->name).content.size_;
    if (sVar2 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->name).content.ptr;
    }
    name.content.size_ = sVar2 + (sVar2 == 0);
    mode = (this->super_Replacer<kj::File>).mode;
    name.content.ptr = pcVar4;
    local_48.mutex = &(pIVar1->impl).mutex;
    local_48.ptr = this_00;
    this_01 = Impl::openEntry(this_00,name,mode);
    bVar5 = this_01.ptr != (EntryImpl *)0x0;
    if (bVar5) {
      File::clone((File *)&local_38,(__fn *)(this->inner).ptr,__child_stack,mode,in_R8);
      EntryImpl::set(this_01.ptr,&local_38);
      Own<const_kj::File>::dispose(&local_38);
      lVar3 = (*(code *)**(undefined8 **)this_00->clock)();
      (pIVar1->impl).value.lastModified.value.value = lVar3;
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&local_48);
  }
  return bVar5;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry->set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }